

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O2

Rational * soplex::ratFromString(Rational *__return_storage_ptr__,char *desc)

{
  _Iter_comp_to_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scipopt[P]soplex_src_soplex_rational_h:163:17),___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __pred;
  _Iter_comp_to_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scipopt[P]soplex_src_soplex_rational_h:163:17),___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __pred_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  ulong uVar7;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  ulong uVar9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  unkbyte10 in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff12;
  string s;
  string den;
  double local_78;
  char *local_70 [4];
  string local_50 [32];
  
  boost::
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
              *)__return_storage_ptr__);
  iVar3 = strcmp(desc,"inf");
  if (iVar3 == 0) {
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)__return_storage_ptr__,(longdouble)1e+100);
  }
  else {
    iVar3 = strcmp(desc,"-inf");
    if (iVar3 == 0) {
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                   *)__return_storage_ptr__,(longdouble)-1e+100);
    }
    else {
      std::__cxx11::string::string((string *)&s,desc,(allocator *)&den);
      lVar4 = std::__cxx11::string::find_first_of((char *)&s,0x47c37a);
      if (lVar4 == -1) {
        if (*s._M_dataplus._M_p == '+') {
          den._M_dataplus._M_p = (pointer)0x0;
          den.field_2._M_allocated_capacity._0_4_ = 1;
          den.field_2._M_allocated_capacity._4_2_ = 0x100;
          den.field_2._M_local_buf[6] = '\0';
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)&den,desc + 1);
        }
        else {
          den._M_dataplus._M_p = (pointer)0x0;
          den.field_2._M_allocated_capacity._0_4_ = 1;
          den.field_2._M_allocated_capacity._4_2_ = 0x100;
          den.field_2._M_local_buf[6] = '\0';
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)&den,desc);
        }
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)__return_storage_ptr__,
                    (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&den);
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&den);
      }
      else {
        std::__cxx11::string::string((string *)&den,"e",(allocator *)local_70);
        _Var5._M_current = (char *)s._M_dataplus;
        if (den._M_string_length != 0 && s._M_string_length != 0) {
          __last._M_current = s._M_dataplus._M_p + s._M_string_length;
          if (den._M_string_length == 1) {
            __pred._M_it1._M_current._2_6_ = in_stack_ffffffffffffff12;
            __pred._0_10_ = in_stack_ffffffffffffff08;
            _Var5 = std::
                    __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_to_iter<soplex::findSubStringIC(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )s._M_dataplus._M_p,__last,__pred);
          }
          else {
            __first._M_current = (char *)s._M_dataplus;
            while ((__pred_00._M_it1._M_current._2_6_ = in_stack_ffffffffffffff12,
                   __pred_00._0_10_ = in_stack_ffffffffffffff08,
                   _Var6 = std::
                           __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_to_iter<soplex::findSubStringIC(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                                     (__first,__last,__pred_00),
                   _Var5._M_current = __last._M_current, _Var6._M_current != __last._M_current &&
                   (__first._M_current = _Var6._M_current + 1,
                   __first._M_current != __last._M_current))) {
              lVar4 = 1;
              uVar8 = extraout_RDX;
              while (bVar2 = anon_func::anon_class_1_0_00000001::operator()
                                       ((anon_class_1_0_00000001 *)
                                        (ulong)(uint)(int)_Var6._M_current[lVar4],
                                        den._M_dataplus._M_p[lVar4],(char)uVar8), bVar2) {
                _Var5 = _Var6;
                if ((lVar4 + (2 - den._M_string_length) == 1) ||
                   (lVar1 = lVar4 + 1, lVar4 = lVar4 + 1, uVar8 = extraout_RDX_00,
                   _Var5._M_current = __last._M_current,
                   _Var6._M_current + lVar1 == __last._M_current)) goto LAB_001635d0;
              }
            }
          }
        }
LAB_001635d0:
        std::__cxx11::string::~string((string *)&den);
        if (_Var5._M_current == s._M_dataplus._M_p + s._M_string_length) {
          local_78 = 0.0;
        }
        else {
          std::__cxx11::string::substr((ulong)&den,(ulong)&s);
          iVar3 = std::__cxx11::stoi(&den,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)&den);
          std::__cxx11::string::substr((ulong)&den,(ulong)&s);
          std::__cxx11::string::operator=((string *)&s,(string *)&den);
          std::__cxx11::string::~string((string *)&den);
          local_78 = (double)iVar3;
        }
        if (*s._M_dataplus._M_p == '.') {
          std::__cxx11::string::insert((ulong)&s,(char *)0x0);
        }
        uVar7 = std::__cxx11::string::find((char)&s,0x2e);
        uVar9 = s._M_string_length;
        if (uVar7 != 0xffffffffffffffff) {
          std::__cxx11::string::string((string *)&den,"1",(allocator *)local_70);
          while (uVar9 = uVar9 - 1, uVar7 != uVar9) {
            std::__cxx11::string::append((char *)&den);
          }
          std::__cxx11::string::erase((ulong)&s,uVar7);
          if (*s._M_dataplus._M_p == '-') {
            std::__cxx11::string::substr((ulong)local_70,(ulong)&s);
            uVar9 = std::__cxx11::string::find_first_not_of((char)local_70,0x30);
            if (uVar9 < s._M_string_length - 1) {
              std::__cxx11::string::substr((ulong)local_50,(ulong)&s);
              std::__cxx11::string::find_first_not_of((char)local_50,0x30);
            }
            std::__cxx11::string::erase((ulong)&s,1);
            if (uVar9 < s._M_string_length - 1) {
              std::__cxx11::string::~string(local_50);
            }
            std::__cxx11::string::~string((string *)local_70);
          }
          else {
            uVar9 = std::__cxx11::string::find_first_not_of((char)&s,0x30);
            if (uVar9 < s._M_string_length - 1) {
              std::__cxx11::string::find_first_not_of((char)&s,0x30);
            }
            std::__cxx11::string::erase((ulong)&s,0);
          }
          std::__cxx11::string::append((char *)&s);
          std::__cxx11::string::append((string *)&s);
          std::__cxx11::string::~string((string *)&den);
        }
        if (*s._M_dataplus._M_p == '+') {
          std::__cxx11::string::substr((ulong)local_70,(ulong)&s);
          den._M_dataplus._M_p = (pointer)0x0;
          den.field_2._M_allocated_capacity._0_4_ = 1;
          den.field_2._M_allocated_capacity._4_2_ = 0x100;
          den.field_2._M_local_buf[6] = '\0';
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)&den,local_70[0]);
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)__return_storage_ptr__,
                      (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&den);
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&den);
          std::__cxx11::string::~string((string *)local_70);
        }
        else {
          den._M_dataplus._M_p = (pointer)0x0;
          den.field_2._M_allocated_capacity._0_4_ = 1;
          den.field_2._M_allocated_capacity._4_2_ = 0x100;
          den.field_2._M_local_buf[6] = '\0';
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)&den,s._M_dataplus._M_p);
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)__return_storage_ptr__,
                      (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&den);
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&den);
        }
        den._M_dataplus._M_p = (pointer)pow(10.0,local_78);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                      *)__return_storage_ptr__,(double *)&den);
      }
      std::__cxx11::string::~string((string *)&s);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Rational ratFromString(const char* desc)
{
   Rational res;

   if(0 == strcmp(desc, "inf"))
   {
      res = 1e100;
   }
   else if(0 == strcmp(desc, "-inf"))
   {
      res = -1e100;
   }
   else
   {
      std::string s(desc);

      /* case 1: string is given in nom/den format */
      if(s.find_first_of(".Ee") == std::string::npos)
      {
         if(s[0] == '+')
            res = Rational(desc + 1);
         else
            res = Rational(desc);
      }
      /* case 2: string is given as base-10 decimal number */
      else
      {
         std::string::const_iterator it = findSubStringIC("e", s);
         int mult = 0;

         if(it != s.end())
         {
            int exponentidx = int(it - s.begin());
            mult = std::stoi(s.substr(exponentidx + 1, s.length()));
            s = s.substr(0, exponentidx);
         }

         // std::cout << s << std::endl;
         if(s[0] == '.')
            s.insert(0, "0");

         size_t pos = s.find('.');

         // if s contains a ., convert it to a rational
         if(pos != std::string::npos)
         {
            size_t exp = s.length() - 1 - pos;
            std::string den("1");

            for(size_t i = 0; i < exp; ++i)
               den.append("0");

            s.erase(pos, 1);
            assert(std::all_of(s.begin() + 1, s.end(), ::isdigit));

            // remove padding 0s
            if(s[0] == '-')
               s.erase(1, SOPLEX_MIN(s.substr(1).find_first_not_of('0'), s.size() - 1));
            else
               s.erase(0, SOPLEX_MIN(s.find_first_not_of('0'), s.size() - 1));

            s.append("/");
            s.append(den);
         }

         if(s[0] == '+')
            res = Rational(s.substr(1));
         else
            res = Rational(s);

         res *= pow(10, mult);
      }
   }

   return res;
}